

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O3

int tremove(lua_State *L)

{
  long n;
  lua_Integer def;
  lua_Integer n_00;
  lua_Integer n_01;
  
  checktab(L,1,7);
  def = luaL_len(L,1);
  n_00 = luaL_optinteger(L,2,def);
  if ((n_00 != def) && (def + 1 < n_00 || n_00 < 1)) {
    luaL_argerror(L,1,"position out of bounds");
  }
  lua_geti(L,1,n_00);
  n_01 = n_00;
  if (n_00 < def) {
    do {
      n = n_01 + 1;
      lua_geti(L,1,n);
      lua_seti(L,1,n_01);
      n_00 = def;
      n_01 = n;
    } while (def != n);
  }
  lua_pushnil(L);
  lua_seti(L,1,n_00);
  return 1;
}

Assistant:

static int tremove (lua_State *L) {
  lua_Integer size = aux_getn(L, 1, TAB_RW);
  lua_Integer pos = luaL_optinteger(L, 2, size);
  if (pos != size)  /* validate 'pos' if given */
    luaL_argcheck(L, 1 <= pos && pos <= size + 1, 1, "position out of bounds");
  lua_geti(L, 1, pos);  /* result = t[pos] */
  for ( ; pos < size; pos++) {
    lua_geti(L, 1, pos + 1);
    lua_seti(L, 1, pos);  /* t[pos] = t[pos + 1] */
  }
  lua_pushnil(L);
  lua_seti(L, 1, pos);  /* t[pos] = nil */
  return 1;
}